

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<std::shared_ptr<chrono::ChMarker>>
          (ChArchiveIn *this,
          ChNameValue<std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
          *bVal)

{
  pointer psVar1;
  long lVar2;
  ulong uVar3;
  shared_ptr<chrono::ChMarker> element;
  size_t arraysize;
  char idname [20];
  shared_ptr<chrono::ChMarker> local_78;
  size_type local_68;
  ChNameValue<std::shared_ptr<chrono::ChMarker>_> local_60;
  char local_48 [24];
  
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(bVal->_value);
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_68);
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  resize(bVal->_value,local_68);
  if (local_68 != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      sprintf(local_48,"%lu",uVar3);
      local_78.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_60._flags = '\0';
      local_60._name = local_48;
      local_60._value = &local_78;
      in<chrono::ChMarker>(this,&local_60);
      psVar1 = (bVal->_value->
               super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(element_type **)((long)psVar1 + lVar2 + -8) =
           local_78.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar1->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar2),
                 &local_78.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      if (local_78.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < local_68);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }